

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void statement(LexState *ls)

{
  uint uVar1;
  l_uint32 *plVar2;
  byte bVar3;
  char cVar4;
  Instruction *pIVar5;
  Dyndata *pDVar6;
  FuncState *pFVar7;
  BlockCnt *pBVar8;
  undefined1 uVar9;
  int iVar10;
  expkind list;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  TString *pTVar15;
  ulong uVar16;
  TString *pTVar17;
  Labeldesc *pLVar18;
  long lVar19;
  long lVar20;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  char *pcVar21;
  FuncState *pFVar22;
  Vardesc *pVVar23;
  bool bVar24;
  BlockCnt bl1;
  undefined1 local_78 [8];
  undefined1 local_70 [24];
  FuncState *local_58;
  uint local_4c;
  undefined1 local_48 [16];
  byte local_38;
  undefined2 local_37;
  lu_byte local_35;
  
  iVar13 = ls->linenumber;
  luaE_incCstack(ls->L);
  iVar10 = (ls->t).token;
  switch(iVar10) {
  case 0x101:
    iVar13 = ls->linenumber;
    luaX_next(ls);
    pTVar15 = luaS_newlstr(ls->L,"break",5);
    iVar10 = luaK_jump(ls->fs);
    pDVar6 = ls->dyd;
    goto LAB_00149333;
  case 0x102:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x105,0x102,iVar13);
    break;
  case 0x103:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x10b:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x112:
  case 0x113:
  case 0x114:
    goto switchD_00148987_caseD_103;
  case 0x107:
    pFVar22 = ls->fs;
    local_38 = pFVar22->nactvar;
    pDVar6 = pFVar22->ls->dyd;
    local_48._8_4_ = (pDVar6->label).n;
    local_48._12_4_ = (pDVar6->gt).n;
    local_37._0_1_ = '\0';
    local_37._1_1_ = '\x01';
    local_48._0_8_ = pFVar22->bl;
    if ((BlockCnt *)local_48._0_8_ == (BlockCnt *)0x0) {
      local_35 = false;
    }
    else {
      local_35 = ((BlockCnt *)local_48._0_8_)->insidetbc != '\0';
    }
    pFVar22->bl = (BlockCnt *)local_48;
    luaX_next(ls);
    pTVar15 = str_checkname(ls);
    iVar10 = (ls->t).token;
    if ((iVar10 == 0x2c) || (iVar10 == 0x10b)) {
      pFVar7 = ls->fs;
      local_4c = (uint)pFVar7->freereg;
      local_58 = pFVar22;
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      new_localvar(ls,pTVar15);
      iVar10 = 1;
      while ((ls->t).token == 0x2c) {
        luaX_next(ls);
        pTVar15 = str_checkname(ls);
        new_localvar(ls,pTVar15);
        iVar10 = iVar10 + 1;
      }
      checknext(ls,0x10b);
      iVar12 = ls->linenumber;
      iVar11 = explist(ls,(expdesc *)local_78);
      adjust_assign(ls,4,iVar11,(expdesc *)local_78);
      adjustlocalvars(ls,4);
      pBVar8 = pFVar7->bl;
      pBVar8->upval = '\x01';
      pBVar8->insidetbc = '\x01';
      pFVar7->needclose = '\x01';
      luaK_checkstack(pFVar7,3);
      forbody(ls,local_4c,iVar12,iVar10,1);
      pFVar22 = local_58;
    }
    else {
      if (iVar10 != 0x3d) {
        pcVar21 = "\'=\' or \'in\' expected";
        goto LAB_00149642;
      }
      pFVar7 = ls->fs;
      local_58 = (FuncState *)CONCAT44(local_58._4_4_,(uint)pFVar7->freereg);
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      pTVar17 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar17);
      new_localvar(ls,pTVar15);
      checknext(ls,0x3d);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      checknext(ls,0x2c);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      if ((ls->t).token == 0x2c) {
        luaX_next(ls);
        subexpr(ls,(expdesc *)local_78,0);
        luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      }
      else {
        luaK_int(pFVar7,(uint)pFVar7->freereg,1);
        luaK_reserveregs(pFVar7,1);
      }
      adjustlocalvars(ls,3);
      forbody(ls,(int)local_58,iVar13,1,0);
    }
    check_match(ls,0x105,0x107,iVar13);
    goto LAB_00149576;
  case 0x108:
    luaX_next(ls);
    singlevar(ls,(expdesc *)local_78);
    while (iVar10 = (ls->t).token, iVar10 == 0x2e) {
      fieldsel(ls,(expdesc *)local_78);
    }
    if (iVar10 == 0x3a) {
      fieldsel(ls,(expdesc *)local_78);
    }
    body(ls,(expdesc *)local_48,(uint)(iVar10 == 0x3a),iVar13);
    check_readonly(ls,(expdesc *)local_78);
    luaK_storevar(ls->fs,(expdesc *)local_78,(expdesc *)local_48);
    luaK_fixline(ls->fs,iVar13);
    break;
  case 0x109:
    luaX_next(ls);
    pFVar22 = ls->fs;
    iVar13 = ls->linenumber;
    pTVar15 = str_checkname(ls);
    iVar10 = ls->fs->firstlabel;
    iVar12 = (ls->dyd->label).n;
    if (iVar10 < iVar12) {
      lVar20 = (long)iVar12 - (long)iVar10;
      pLVar18 = (ls->dyd->label).arr + iVar10;
      do {
        if (pLVar18->name == pTVar15) goto LAB_00148c2a;
        pLVar18 = pLVar18 + 1;
        lVar20 = lVar20 + -1;
      } while (lVar20 != 0);
    }
    pLVar18 = (Labeldesc *)0x0;
LAB_00148c2a:
    if (pLVar18 != (Labeldesc *)0x0) {
      uVar14 = (ulong)pLVar18->nactvar;
      do {
        if ((int)uVar14 < 1) {
          iVar13 = 0;
          break;
        }
        pVVar23 = (pFVar22->ls->dyd->actvar).arr;
        lVar20 = (long)pFVar22->firstlocal + uVar14;
        cVar4 = *(char *)((long)pVVar23 + lVar20 * 0x18 + -0xf);
        if (cVar4 != '\x03') {
          iVar13 = *(byte *)((long)pVVar23 + lVar20 * 0x18 + -0xe) + 1;
        }
        uVar14 = uVar14 - 1;
      } while (cVar4 == '\x03');
      iVar10 = luaY_nvarstack(pFVar22);
      if (iVar13 < iVar10) {
        luaK_codeABCk(pFVar22,OP_CLOSE,iVar13,0,0,0);
      }
      iVar13 = luaK_jump(pFVar22);
      luaK_patchlist(pFVar22,iVar13,pLVar18->pc);
      break;
    }
    iVar10 = luaK_jump(pFVar22);
    pDVar6 = ls->dyd;
LAB_00149333:
    newlabelentry(ls,&pDVar6->gt,pTVar15,iVar13,iVar10);
    break;
  case 0x10a:
    pFVar22 = ls->fs;
    local_78._0_4_ = 0xffffffff;
    do {
      test_then_block(ls,(int *)local_78);
      iVar10 = (ls->t).token;
    } while (iVar10 == 0x104);
    if (iVar10 == 0x103) {
      luaX_next(ls);
      block(ls);
    }
    check_match(ls,0x105,0x10a,iVar13);
    list = local_78._0_4_;
    goto LAB_0014939d;
  case 0x10c:
    luaX_next(ls);
    if ((ls->t).token != 0x108) {
      pFVar22 = ls->fs;
      iVar13 = 0;
      iVar10 = -1;
      do {
        pTVar15 = str_checkname(ls);
        iVar12 = new_localvar(ls,pTVar15);
        if ((ls->t).token == 0x3c) {
          luaX_next(ls);
          pTVar15 = str_checkname(ls);
          pcVar21 = pTVar15->contents;
          checknext(ls,0x3e);
          iVar11 = strcmp(pcVar21,"const");
          if (iVar11 == 0) {
            uVar9 = 1;
            goto LAB_00148f5d;
          }
          iVar11 = strcmp(pcVar21,"close");
          if (iVar11 != 0) {
            pcVar21 = luaO_pushfstring(ls->L,"unknown attribute \'%s\'",pcVar21);
            goto LAB_00149601;
          }
          *(undefined1 *)
           ((long)(pFVar22->ls->dyd->actvar).arr +
           ((long)iVar12 + (long)pFVar22->firstlocal) * 0x18 + 9) = 2;
          if (iVar10 != -1) {
            luaK_semerror(ls,"multiple to-be-closed variables in local list");
          }
          iVar10 = (uint)pFVar22->nactvar + iVar13;
        }
        else {
          uVar9 = 0;
LAB_00148f5d:
          *(undefined1 *)
           ((long)(pFVar22->ls->dyd->actvar).arr +
           ((long)iVar12 + (long)pFVar22->firstlocal) * 0x18 + 9) = uVar9;
        }
        if ((ls->t).token != 0x2c) goto LAB_00148f8f;
        luaX_next(ls);
        iVar13 = iVar13 + 1;
      } while( true );
    }
    luaX_next(ls);
    pFVar22 = ls->fs;
    bVar3 = pFVar22->nactvar;
    pTVar15 = str_checkname(ls);
    new_localvar(ls,pTVar15);
    adjustlocalvars(ls,1);
    body(ls,(expdesc *)local_78,0,ls->linenumber);
    pFVar22->f->locvars
    [*(short *)((long)(pFVar22->ls->dyd->actvar).arr +
               ((long)pFVar22->firstlocal + (ulong)bVar3) * 0x18 + 0xc)].startpc = pFVar22->pc;
    break;
  case 0x110:
    pFVar22 = ls->fs;
    iVar10 = luaK_getlabel(pFVar22);
    local_38 = pFVar22->nactvar;
    pDVar6 = pFVar22->ls->dyd;
    local_70._0_4_ = (pDVar6->label).n;
    local_70._4_4_ = (pDVar6->gt).n;
    local_70[9] = 0;
    local_70[8] = local_38;
    local_70._10_2_ = 1;
    local_78 = (undefined1  [8])pFVar22->bl;
    if (local_78 == (undefined1  [8])0x0) {
      local_35 = false;
    }
    else {
      local_35 = *(lu_byte *)((long)&(((LHS_assign *)local_78)->v).u + 3) != '\0';
    }
    local_70[0xb] = local_35;
    pFVar22->bl = (BlockCnt *)local_78;
    local_37._0_1_ = '\0';
    local_37._1_1_ = '\0';
    pFVar22->bl = (BlockCnt *)local_48;
    local_48._0_8_ = (BlockCnt *)local_78;
    local_48._8_4_ = local_70._0_4_;
    local_48._12_4_ = local_70._4_4_;
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x114,0x110,iVar13);
    iVar13 = cond(ls);
    leaveblock(pFVar22);
    if ((lu_byte)local_37 != '\0') {
      iVar12 = luaK_jump(pFVar22);
      luaK_patchtohere(pFVar22,iVar13);
      uVar16 = (ulong)local_38;
      uVar14 = extraout_RDX;
      do {
        if ((int)uVar16 < 1) {
          iVar13 = 0;
          break;
        }
        pVVar23 = (pFVar22->ls->dyd->actvar).arr;
        lVar20 = (long)pFVar22->firstlocal + uVar16;
        cVar4 = *(char *)((long)pVVar23 + lVar20 * 0x18 + -0xf);
        if (cVar4 != '\x03') {
          uVar14 = (ulong)(*(byte *)((long)pVVar23 + lVar20 * 0x18 + -0xe) + 1);
        }
        iVar13 = (int)uVar14;
        uVar16 = uVar16 - 1;
      } while (cVar4 == '\x03');
      luaK_codeABCk(pFVar22,OP_CLOSE,iVar13,0,0,0);
      iVar13 = luaK_jump(pFVar22);
      luaK_patchtohere(pFVar22,iVar12);
    }
    luaK_patchlist(pFVar22,iVar13,iVar10);
LAB_00149576:
    leaveblock(pFVar22);
    break;
  case 0x111:
    luaX_next(ls);
    pFVar22 = ls->fs;
    iVar12 = luaY_nvarstack(pFVar22);
    iVar13 = (ls->t).token;
    uVar1 = iVar13 - 0x103;
    iVar10 = 0;
    if ((iVar13 != 0x3b) &&
       (iVar10 = 0, (uVar1 < 0x1e & (byte)(0x20020007 >> ((byte)uVar1 & 0x1f))) == 0)) {
      iVar10 = explist(ls,(expdesc *)local_78);
      if ((local_78._0_4_ & ~VNIL) == VCALL) {
        iVar13 = -1;
        luaK_setreturns(pFVar22,(expdesc *)local_78,-1);
        bVar24 = iVar10 == 1;
        iVar10 = iVar13;
        if (((bVar24) && (local_78._0_4_ == VCALL)) && (pFVar22->bl->insidetbc == '\0')) {
          pIVar5 = pFVar22->f->code;
          pIVar5[(int)local_70._0_4_] = pIVar5[(int)local_70._0_4_] & 0xffffff80 | 0x45;
        }
      }
      else if (iVar10 == 1) {
        iVar12 = luaK_exp2anyreg(pFVar22,(expdesc *)local_78);
        iVar10 = 1;
      }
      else {
        luaK_exp2nextreg(pFVar22,(expdesc *)local_78);
      }
    }
    luaK_ret(pFVar22,iVar12,iVar10);
    if ((ls->t).token != 0x3b) break;
LAB_001495b4:
    luaX_next(ls);
    break;
  case 0x115:
    pFVar22 = ls->fs;
    luaX_next(ls);
    iVar10 = luaK_getlabel(pFVar22);
    list = cond(ls);
    pDVar6 = pFVar22->ls->dyd;
    local_70._0_4_ = (pDVar6->label).n;
    local_70._4_4_ = (pDVar6->gt).n;
    local_70[9] = 0;
    local_70[8] = pFVar22->nactvar;
    local_70._10_2_ = 1;
    local_78 = (undefined1  [8])pFVar22->bl;
    if (local_78 == (undefined1  [8])0x0) {
      bVar24 = false;
    }
    else {
      bVar24 = *(lu_byte *)((long)&(((LHS_assign *)local_78)->v).u + 3) != '\0';
    }
    local_70[0xb] = bVar24;
    pFVar22->bl = (BlockCnt *)local_78;
    checknext(ls,0x102);
    block(ls);
    iVar12 = luaK_jump(pFVar22);
    luaK_patchlist(pFVar22,iVar12,iVar10);
    check_match(ls,0x105,0x115,iVar13);
    leaveblock(pFVar22);
LAB_0014939d:
    luaK_patchtohere(pFVar22,list);
    break;
  default:
    if (iVar10 == 0x11f) {
      luaX_next(ls);
      pTVar15 = str_checkname(ls);
      checknext(ls,0x11f);
      while ((iVar10 = (ls->t).token, iVar10 == 0x11f || (iVar10 == 0x3b))) {
        statement(ls);
      }
      iVar12 = ls->fs->firstlabel;
      iVar11 = (ls->dyd->label).n;
      if (iVar12 < iVar11) {
        lVar20 = (long)iVar11 - (long)iVar12;
        pLVar18 = (ls->dyd->label).arr + iVar12;
        do {
          if (pLVar18->name == pTVar15) goto LAB_00148e31;
          pLVar18 = pLVar18 + 1;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      pLVar18 = (Labeldesc *)0x0;
LAB_00148e31:
      if (pLVar18 != (Labeldesc *)0x0) {
        pcVar21 = luaO_pushfstring(ls->L,"label \'%s\' already defined on line %d",pTVar15->contents
                                   ,(ulong)(uint)pLVar18->line);
LAB_00149601:
        luaK_semerror(ls,pcVar21);
      }
      iVar12 = 1;
      if ((2 < iVar10 - 0x103U) && (iVar10 != 0x120)) {
        iVar12 = 0;
      }
      createlabel(ls,pTVar15,iVar13,iVar12);
      break;
    }
    if (iVar10 == 0x3b) goto LAB_001495b4;
    goto switchD_00148987_caseD_103;
  }
LAB_001495bc:
  pFVar22 = ls->fs;
  iVar13 = luaY_nvarstack(pFVar22);
  pFVar22->freereg = (lu_byte)iVar13;
  plVar2 = &ls->L->nCcalls;
  *plVar2 = *plVar2 - 1;
  return;
LAB_00148f8f:
  if ((ls->t).token == 0x3d) {
    luaX_next(ls);
    iVar11 = explist(ls,(expdesc *)local_78);
  }
  else {
    local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
    iVar11 = 0;
  }
  if (((iVar11 + -1 == iVar13) &&
      (pVVar23 = (pFVar22->ls->dyd->actvar).arr + (long)iVar12 + (long)pFVar22->firstlocal,
      (pVVar23->vd).kind == '\x01')) &&
     (iVar12 = luaK_exp2const(pFVar22,(expdesc *)local_78,&pVVar23->k), iVar12 != 0)) {
    (pVVar23->vd).kind = '\x03';
    adjustlocalvars(ls,iVar13);
    pFVar22->nactvar = pFVar22->nactvar + '\x01';
    uVar14 = extraout_RDX_00;
  }
  else {
    adjust_assign(ls,iVar13 + 1,iVar11,(expdesc *)local_78);
    adjustlocalvars(ls,iVar13 + 1);
    uVar14 = extraout_RDX_01;
  }
  if (iVar10 != -1) {
    pBVar8 = pFVar22->bl;
    pBVar8->upval = '\x01';
    pBVar8->insidetbc = '\x01';
    pFVar22->needclose = '\x01';
    lVar20 = (long)(iVar10 + -1);
    do {
      if (iVar10 < 1) {
        iVar13 = 0;
        break;
      }
      pVVar23 = (pFVar22->ls->dyd->actvar).arr;
      lVar19 = pFVar22->firstlocal + lVar20;
      cVar4 = *(char *)((long)pVVar23 + lVar19 * 0x18 + 9);
      if (cVar4 != '\x03') {
        uVar14 = (ulong)((&pVVar23->vd)[lVar19].ridx + 1);
      }
      iVar13 = (int)uVar14;
      lVar20 = lVar20 + -1;
      iVar10 = iVar10 + -1;
    } while (cVar4 == '\x03');
    luaK_codeABCk(pFVar22,OP_TBC,iVar13,0,0,0);
  }
  goto LAB_001495bc;
switchD_00148987_caseD_103:
  pFVar22 = ls->fs;
  suffixedexp(ls,(expdesc *)local_70);
  iVar13 = (ls->t).token;
  if ((iVar13 == 0x3d) || (iVar13 == 0x2c)) {
    local_78 = (undefined1  [8])0x0;
    restassign(ls,(LHS_assign *)local_78,1);
  }
  else {
    if (local_70._0_4_ != VCALL) {
      pcVar21 = "syntax error";
LAB_00149642:
      luaX_syntaxerror(ls,pcVar21);
    }
    *(undefined1 *)((long)pFVar22->f->code + (long)(int)local_70._8_4_ * 4 + 3) = 1;
  }
  goto LAB_001495bc;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
        localfunc(ls);
      else
        localstat(ls);
      break;
    }
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK: {  /* stat -> breakstat */
      breakstat(ls);
      break;
    }
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      luaX_next(ls);  /* skip 'goto' */
      gotostat(ls);
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= luaY_nvarstack(ls->fs));
  ls->fs->freereg = luaY_nvarstack(ls->fs);  /* free registers */
  leavelevel(ls);
}